

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univ_map_oa.hpp
# Opt level: O3

Wrapper_Holder __thiscall
OpenAmulet::Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_>::GetAt
          (Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_> *this,Name_Num *aKey)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  key_type *in_RDX;
  
  cVar1 = std::
          _Rb_tree<Name_Num,_std::pair<const_Name_Num,_Wrapper_Holder>,_std::_Select1st<std::pair<const_Name_Num,_Wrapper_Holder>_>,_std::less<Name_Num>,_std::allocator<std::pair<const_Name_Num,_Wrapper_Holder>_>_>
          ::find((_Rb_tree<Name_Num,_std::pair<const_Name_Num,_Wrapper_Holder>,_std::_Select1st<std::pair<const_Name_Num,_Wrapper_Holder>_>,_std::less<Name_Num>,_std::allocator<std::pair<const_Name_Num,_Wrapper_Holder>_>_>
                  *)aKey,in_RDX);
  if (cVar1._M_node == (_Base_ptr)&aKey->number) {
    p_Var2 = (_Base_ptr)aKey[3].name;
  }
  else {
    p_Var2 = cVar1._M_node[1]._M_left;
  }
  *(_Base_ptr *)&(this->mMap)._M_t._M_impl = p_Var2;
  if (p_Var2 != (_Base_ptr)0x0) {
    *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
  }
  return (Wrapper_Holder)(Am_Wrapper *)this;
}

Assistant:

Item GetAt(const Key &aKey) const
  {
#ifdef DEBUG
    // This is for debugging propose only. If you want to look at the
    // map change the dumpMap value to true within your debugger
    bool dumpMap(false);
    if (dumpMap == true) {
      Dump();
    }
#endif

    // do we have an item with aKey?
    typename std::map<Key, Item, Compare>::const_iterator it = mMap.find(aKey);
    if (it != mMap.end()) {
      return ((*it).second);
    } else {
      // the key wasn't found so return the default object value
      return (mDefaultReturn);
    }
  }